

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sleigh.cc
# Opt level: O0

void __thiscall
SleighBuilder::SleighBuilder
          (SleighBuilder *this,ParserWalker *w,DisassemblyCache *dcache,PcodeCacher *pc,
          AddrSpace *cspc,AddrSpace *uspc,uint4 umask)

{
  Address *this_00;
  uintb uVar1;
  AddrSpace *uspc_local;
  AddrSpace *cspc_local;
  PcodeCacher *pc_local;
  DisassemblyCache *dcache_local;
  ParserWalker *w_local;
  SleighBuilder *this_local;
  
  PcodeBuilder::PcodeBuilder(&this->super_PcodeBuilder,0);
  (this->super_PcodeBuilder)._vptr_PcodeBuilder = (_func_int **)&PTR_dump_00858010;
  (this->super_PcodeBuilder).walker = w;
  this->discache = dcache;
  this->cache = pc;
  this->const_space = cspc;
  this->uniq_space = uspc;
  this->uniquemask = (ulong)umask;
  this_00 = ParserWalker::getAddr((this->super_PcodeBuilder).walker);
  uVar1 = Address::getOffset(this_00);
  this->uniqueoffset = (uVar1 & this->uniquemask) << 4;
  return;
}

Assistant:

SleighBuilder::SleighBuilder(ParserWalker *w,DisassemblyCache *dcache,PcodeCacher *pc,AddrSpace *cspc,
			     AddrSpace *uspc,uint4 umask)
  : PcodeBuilder(0)
{
  walker = w;
  discache = dcache;
  cache = pc;
  const_space = cspc;
  uniq_space = uspc;
  uniquemask = umask;
  uniqueoffset = (walker->getAddr().getOffset() & uniquemask)<<4;
}